

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::ResourceBundle::getString
          (UnicodeString *__return_storage_ptr__,ResourceBundle *this,UErrorCode *status)

{
  ConstChar16Ptr local_30 [3];
  int32_t len;
  
  len = 0;
  local_30[0].p_ = ures_getString_63(this->fResource,&len,status);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_30,len);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString ResourceBundle::getString(UErrorCode& status) const {
    int32_t len = 0;
    const UChar *r = ures_getString(fResource, &len, &status);
    return UnicodeString(TRUE, r, len);
}